

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Object_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Point_Object_State_PDU::Point_Object_State_PDU(Point_Object_State_PDU *this)

{
  Object_State_Header::Object_State_Header(&this->super_Object_State_Header);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Point_Object_State_PDU_002173d8;
  DATA_TYPE::ObjectType::ObjectType(&this->m_ObjTyp);
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Loc);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_Ori);
  DATA_TYPE::PointObjectAppearance::PointObjectAppearance(&this->m_Apperance);
  this->m_ui16Padding = 0;
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_ReqID);
  DATA_TYPE::SimulationIdentifier::SimulationIdentifier(&this->m_RecvID);
  this->m_ui32Padding1 = 0;
  (this->super_Object_State_Header).field_0x4b = 0;
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = '+';
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength = 0x58;
  return;
}

Assistant:

Point_Object_State_PDU::Point_Object_State_PDU() :
    m_ui16Padding( 0 ),
    m_ui32Padding1( 0 )
{
    m_ModificationUnion.m_ui8Modifications = 0;
    m_ui8PDUType = PointObjectState_PDU_Type;
    m_ui16PDULength = POINT_OBJECT_STATE_PDU_SIZE;
}